

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

void __thiscall S2Loop::Invert(S2Loop *this)

{
  VType *pVVar1;
  int iVar2;
  S2Point *pSVar3;
  VType VVar4;
  S2Point *pSVar5;
  S2Point *pSVar6;
  uint uVar7;
  S2LatLngRect local_68;
  S1Interval local_38;
  R1Interval local_28;
  
  if (this->owns_vertices_ == false) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x169,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_68.lat_.bounds_.c_[0],"Check failed: owns_vertices_ ",0x1d);
    abort();
  }
  (this->unindexed_contains_calls_).super___atomic_base<int>._M_i = 0;
  MutableS2ShapeIndex::Clear(&this->index_);
  iVar2 = this->num_vertices_;
  if ((long)iVar2 == 1) {
    local_68.super_S2Region._vptr_S2Region = (_func_int **)0x0;
    local_68.lat_.bounds_.c_[0] = 0.0;
    if ((this->origin_inside_ & 1U) == 0) {
      uVar7 = 0xbff00000;
    }
    else {
      uVar7 = 0x3ff00000;
    }
    pSVar3 = this->vertices_;
    pSVar3->c_[0] = 0.0;
    pSVar3->c_[1] = 0.0;
    pSVar3->c_[2] = (VType)((ulong)uVar7 << 0x20);
  }
  else {
    pSVar3 = this->vertices_;
    pSVar6 = pSVar3 + (long)iVar2 + -1;
    if (pSVar3 < pSVar6 && iVar2 != 0) {
      do {
        pSVar5 = pSVar3 + 1;
        local_68.lat_.bounds_.c_[1] = pSVar3->c_[2];
        local_68.super_S2Region._vptr_S2Region = (_func_int **)pSVar3->c_[0];
        local_68.lat_.bounds_.c_[0] = pSVar3->c_[1];
        pSVar3->c_[2] = pSVar6->c_[2];
        VVar4 = pSVar6->c_[1];
        pSVar3->c_[0] = pSVar6->c_[0];
        pSVar3->c_[1] = VVar4;
        pSVar6->c_[2] = local_68.lat_.bounds_.c_[1];
        pSVar6->c_[0] = (VType)local_68.super_S2Region._vptr_S2Region;
        pSVar6->c_[1] = local_68.lat_.bounds_.c_[0];
        pSVar6 = pSVar6 + -1;
        pSVar3 = pSVar5;
      } while (pSVar5 < pSVar6);
    }
  }
  this->origin_inside_ = (bool)(this->origin_inside_ ^ 1);
  if (((this->bound_).lat_.bounds_.c_[0] <= -1.5707963267948966) ||
     (pVVar1 = (this->bound_).lat_.bounds_.c_ + 1,
     1.5707963267948966 < *pVVar1 || *pVVar1 == 1.5707963267948966)) {
    InitBound(this);
  }
  else {
    local_28.bounds_.c_[0] = -1.5707963267948966;
    local_28.bounds_.c_[1] = 1.5707963267948966;
    local_38.bounds_.c_[0] = -3.141592653589793;
    local_38.bounds_.c_[1] = 3.141592653589793;
    S2LatLngRect::S2LatLngRect(&local_68,&local_28,&local_38);
    (this->bound_).lng_.bounds_.c_[0] = local_68.lng_.bounds_.c_[0];
    (this->bound_).lng_.bounds_.c_[1] = local_68.lng_.bounds_.c_[1];
    (this->bound_).lat_.bounds_.c_[0] = local_68.lat_.bounds_.c_[0];
    (this->bound_).lat_.bounds_.c_[1] = local_68.lat_.bounds_.c_[1];
    (this->subregion_bound_).lng_.bounds_.c_[0] = local_68.lng_.bounds_.c_[0];
    (this->subregion_bound_).lng_.bounds_.c_[1] = local_68.lng_.bounds_.c_[1];
    (this->subregion_bound_).lat_.bounds_.c_[0] = local_68.lat_.bounds_.c_[0];
    (this->subregion_bound_).lat_.bounds_.c_[1] = local_68.lat_.bounds_.c_[1];
  }
  InitIndex(this);
  return;
}

Assistant:

void S2Loop::Invert() {
  S2_CHECK(owns_vertices_);
  ClearIndex();
  if (is_empty_or_full()) {
    vertices_[0] = is_full() ? kEmptyVertex() : kFullVertex();
  } else {
    std::reverse(vertices_, vertices_ + num_vertices());
  }
  // origin_inside_ must be set correctly before building the S2ShapeIndex.
  origin_inside_ ^= true;
  if (bound_.lat().lo() > -M_PI_2 && bound_.lat().hi() < M_PI_2) {
    // The complement of this loop contains both poles.
    subregion_bound_ = bound_ = S2LatLngRect::Full();
  } else {
    InitBound();
  }
  InitIndex();
}